

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int PNode_equal(Parser *p,PNode *pn,D_Reduction *r,VecZNode *path,D_Shift *sh)

{
  uint32 *puVar1;
  uint uVar2;
  PNode *pPVar3;
  PNode *pPVar4;
  PNode *pPVar5;
  ulong uVar6;
  PNode *pPVar7;
  PNode *pPVar8;
  PNode *_t;
  PNode *_t_1;
  
  if (sh != (D_Shift *)0x0) {
    return (int)(pn->shift == sh);
  }
  if (pn->reduction == r) {
    uVar2 = (pn->children).n;
    if (uVar2 != 0 || path != (VecZNode *)0x0) {
      if (uVar2 != path->n) {
        return 0;
      }
      if ((ulong)uVar2 != 0) {
        uVar6 = 0;
        do {
          pPVar8 = (pn->children).v[uVar6];
          pPVar3 = path->v[~(uint)uVar6 + uVar2]->pn;
          pPVar5 = pPVar8->latest;
          pPVar4 = pPVar5;
          pPVar7 = pPVar5->latest;
          if (pPVar5 != pPVar5->latest) {
            do {
              pPVar5 = pPVar7;
              pPVar5->refcount = pPVar5->refcount + 1;
              puVar1 = &pPVar4->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_PNode(p,pPVar4);
              }
              pPVar8->latest = pPVar5;
              pPVar4 = pPVar5;
              pPVar7 = pPVar5->latest;
            } while (pPVar5 != pPVar5->latest);
          }
          pPVar8 = pPVar3->latest;
          pPVar4 = pPVar8->latest;
          pPVar7 = pPVar8;
          if (pPVar8 != pPVar8->latest) {
            do {
              pPVar8 = pPVar4;
              pPVar8->refcount = pPVar8->refcount + 1;
              puVar1 = &pPVar7->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_PNode(p,pPVar7);
              }
              pPVar3->latest = pPVar8;
              pPVar4 = pPVar8->latest;
              pPVar7 = pPVar8;
            } while (pPVar8 != pPVar8->latest);
          }
          if (pPVar5 != pPVar8) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar2);
      }
    }
    return 1;
  }
  return 0;
}

Assistant:

static int PNode_equal(Parser *p, PNode *pn, D_Reduction *r, VecZNode *path, D_Shift *sh) {
  uint i, n = pn->children.n;
  if (sh) return sh == pn->shift;
  if (r != pn->reduction) return 0;
  if (!path && !n) return 1;
  if (n == path->n) {
    for (i = 0; i < n; i++) {
      PNode *x = pn->children.v[i], *y = path->v[n - i - 1]->pn;
      LATEST(p, x);
      LATEST(p, y);
      if (x != y) return 0;
    }
    return 1;
  }
  return 0;
}